

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O2

void __thiscall
RecursiveMutexTest_BasicLock_Test<yamc::alternate::recursive_mutex>::
RecursiveMutexTest_BasicLock_Test
          (RecursiveMutexTest_BasicLock_Test<yamc::alternate::recursive_mutex> *this)

{
  RecursiveMutexTest<yamc::alternate::recursive_mutex>::RecursiveMutexTest
            (&this->super_RecursiveMutexTest<yamc::alternate::recursive_mutex>);
  (this->super_RecursiveMutexTest<yamc::alternate::recursive_mutex>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_00270aa8;
  return;
}

Assistant:

TYPED_TEST(RecursiveMutexTest, BasicLock)
{
  TypeParam mtx;
  std::size_t c1 = 0, c2 = 0, c3 = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        std::lock_guard<TypeParam> lk1(mtx);
        auto before_cnt = ++c1;
        {
          std::lock_guard<TypeParam> lk2(mtx);
          ++c2;
        }
        auto after_cnt = ++c3;
        ASSERT_TRUE(before_cnt == after_cnt);
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, c1);
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, c2);
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, c3);
}